

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void JS_FreeContext(JSContext *ctx)

{
  int iVar1;
  list_head *plVar2;
  int64_t iVar3;
  JSValueUnion JVar4;
  JSShape *sh;
  list_head *plVar5;
  int iVar6;
  JSRefCountHeader *p;
  JSRuntime *pJVar7;
  long lVar8;
  long lVar9;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue v_09;
  JSValue v_10;
  JSValue v_11;
  JSValue v_12;
  
  pJVar7 = ctx->rt;
  iVar6 = (ctx->header).ref_count;
  (ctx->header).ref_count = iVar6 + -1;
  if (iVar6 < 2) {
    plVar5 = (ctx->loaded_modules).next;
    while (plVar5 != &ctx->loaded_modules) {
      plVar2 = plVar5->next;
      js_free_module_def(ctx,(JSModuleDef *)&plVar5[-1].next);
      plVar5 = plVar2;
    }
    iVar3 = (ctx->global_obj).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->global_obj).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v.tag = iVar3;
        v.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
    }
    iVar3 = (ctx->global_var_obj).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->global_var_obj).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_00.tag = iVar3;
        v_00.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
    }
    iVar3 = (ctx->throw_type_error).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->throw_type_error).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_01.tag = iVar3;
        v_01.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_01);
      }
    }
    iVar3 = (ctx->eval_obj).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->eval_obj).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_02.tag = iVar3;
        v_02.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_02);
      }
    }
    iVar3 = (ctx->array_proto_values).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->array_proto_values).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_03.tag = iVar3;
        v_03.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_03);
      }
    }
    lVar8 = 0xa0;
    do {
      iVar3 = *(int64_t *)((long)&(ctx->header).ref_count + lVar8);
      if (0xfffffff4 < (uint)iVar3) {
        JVar4 = (JSValueUnion)((JSValueUnion *)((long)ctx + lVar8 + -8))->ptr;
        iVar6 = *JVar4.ptr;
        *(int *)JVar4.ptr = iVar6 + -1;
        if (iVar6 < 2) {
          v_04.tag = iVar3;
          v_04.u.ptr = JVar4.ptr;
          __JS_FreeValueRT(ctx->rt,v_04);
        }
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x120);
    iVar6 = pJVar7->class_count;
    if (0 < iVar6) {
      lVar9 = 8;
      lVar8 = 0;
      do {
        iVar3 = *(int64_t *)((long)&ctx->class_proto->u + lVar9);
        if (0xfffffff4 < (uint)iVar3) {
          JVar4 = (JSValueUnion)((JSValueUnion *)((long)ctx->class_proto + lVar9 + -8))->ptr;
          iVar1 = *JVar4.ptr;
          *(int *)JVar4.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            v_05.tag = iVar3;
            v_05.u.ptr = JVar4.ptr;
            __JS_FreeValueRT(ctx->rt,v_05);
            iVar6 = pJVar7->class_count;
          }
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 < iVar6);
    }
    (*(pJVar7->mf).js_free)(&pJVar7->malloc_state,ctx->class_proto);
    iVar3 = (ctx->iterator_proto).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->iterator_proto).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_06.tag = iVar3;
        v_06.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_06);
      }
    }
    iVar3 = (ctx->async_iterator_proto).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->async_iterator_proto).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_07.tag = iVar3;
        v_07.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_07);
      }
    }
    iVar3 = (ctx->promise_ctor).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->promise_ctor).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_08.tag = iVar3;
        v_08.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_08);
      }
    }
    iVar3 = (ctx->array_ctor).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->array_ctor).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_09.tag = iVar3;
        v_09.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_09);
      }
    }
    iVar3 = (ctx->regexp_ctor).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->regexp_ctor).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_10.tag = iVar3;
        v_10.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_10);
      }
    }
    iVar3 = (ctx->function_ctor).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->function_ctor).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_11.tag = iVar3;
        v_11.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_11);
      }
    }
    iVar3 = (ctx->function_proto).tag;
    if (0xfffffff4 < (uint)iVar3) {
      JVar4 = (JSValueUnion)(ctx->function_proto).u.ptr;
      iVar6 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar6 + -1;
      if (iVar6 < 2) {
        v_12.tag = iVar3;
        v_12.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(ctx->rt,v_12);
      }
    }
    pJVar7 = ctx->rt;
    sh = ctx->array_shape;
    if ((sh != (JSShape *)0x0) &&
       (iVar6 = (sh->header).ref_count, (sh->header).ref_count = iVar6 + -1, iVar6 < 2)) {
      js_free_shape0(pJVar7,sh);
      pJVar7 = ctx->rt;
    }
    plVar5 = (ctx->link).prev;
    plVar2 = (ctx->link).next;
    plVar5->next = plVar2;
    plVar2->prev = plVar5;
    (ctx->link).prev = (list_head *)0x0;
    (ctx->link).next = (list_head *)0x0;
    plVar5 = (ctx->header).link.prev;
    plVar2 = (ctx->header).link.next;
    plVar5->next = plVar2;
    plVar2->prev = plVar5;
    (ctx->header).link.prev = (list_head *)0x0;
    (ctx->header).link.next = (list_head *)0x0;
    (*(pJVar7->mf).js_free)(&pJVar7->malloc_state,ctx);
    return;
  }
  return;
}

Assistant:

void JS_FreeContext(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    int i;

    if (--ctx->header.ref_count > 0)
        return;
    assert(ctx->header.ref_count == 0);
    
#ifdef DUMP_ATOMS
    JS_DumpAtoms(ctx->rt);
#endif
#ifdef DUMP_SHAPES
    JS_DumpShapes(ctx->rt);
#endif
#ifdef DUMP_OBJECTS
    {
        struct list_head *el;
        JSGCObjectHeader *p;
        printf("JSObjects: {\n");
        JS_DumpObjectHeader(ctx->rt);
        list_for_each(el, &rt->gc_obj_list) {
            p = list_entry(el, JSGCObjectHeader, link);
            JS_DumpGCObject(rt, p);
        }
        printf("}\n");
    }
#endif
#ifdef DUMP_MEM
    {
        JSMemoryUsage stats;
        JS_ComputeMemoryUsage(rt, &stats);
        JS_DumpMemoryUsage(stdout, &stats, rt);
    }
#endif

    js_free_modules(ctx, JS_FREE_MODULE_ALL);

    JS_FreeValue(ctx, ctx->global_obj);
    JS_FreeValue(ctx, ctx->global_var_obj);

    JS_FreeValue(ctx, ctx->throw_type_error);
    JS_FreeValue(ctx, ctx->eval_obj);

    JS_FreeValue(ctx, ctx->array_proto_values);
    for(i = 0; i < JS_NATIVE_ERROR_COUNT; i++) {
        JS_FreeValue(ctx, ctx->native_error_proto[i]);
    }
    for(i = 0; i < rt->class_count; i++) {
        JS_FreeValue(ctx, ctx->class_proto[i]);
    }
    js_free_rt(rt, ctx->class_proto);
    JS_FreeValue(ctx, ctx->iterator_proto);
    JS_FreeValue(ctx, ctx->async_iterator_proto);
    JS_FreeValue(ctx, ctx->promise_ctor);
    JS_FreeValue(ctx, ctx->array_ctor);
    JS_FreeValue(ctx, ctx->regexp_ctor);
    JS_FreeValue(ctx, ctx->function_ctor);
    JS_FreeValue(ctx, ctx->function_proto);

    js_free_shape_null(ctx->rt, ctx->array_shape);

    list_del(&ctx->link);
    remove_gc_object(&ctx->header);
    js_free_rt(ctx->rt, ctx);
}